

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

uint32_t jit_cpudetect(lua_State *L)

{
  int iVar1;
  uint32_t fam;
  uint32_t features [4];
  uint32_t vendor [4];
  uint32_t flags;
  uint local_38 [2];
  uint local_30;
  uint local_2c;
  undefined1 local_28 [8];
  int local_20;
  uint local_c;
  
  local_c = 0;
  iVar1 = lj_vm_cpuid(0,local_28);
  if ((iVar1 != 0) && (iVar1 = lj_vm_cpuid(1,local_38), iVar1 != 0)) {
    local_c = (local_30 >> 0x13 & 1) << 7 |
              (local_30 & 1) << 6 |
              (local_2c >> 0x1a & 1) << 5 | (local_2c >> 0xf & 1) << 4 | local_c;
    if (local_20 == 0x6c65746e) {
      if ((local_38[0] & 0xff00f00) == 0xf00) {
        local_c = local_c | 0x100;
      }
      else if ((local_38[0] & 0xfff0ff0) == 0x106c0) {
        local_c = local_c | 0x800;
      }
    }
    else if (local_20 == 0x444d4163) {
      if ((local_38[0] & 0xff00f00) == 0xf00) {
        local_c = local_c | 0x400;
      }
      if (0xeff < (local_38[0] & 0xff00f00)) {
        local_c = local_c | 0x200;
      }
    }
  }
  return local_c;
}

Assistant:

static uint32_t jit_cpudetect(lua_State *L)
{
  uint32_t flags = 0;
#if LJ_TARGET_X86ORX64
  uint32_t vendor[4];
  uint32_t features[4];
  if (lj_vm_cpuid(0, vendor) && lj_vm_cpuid(1, features)) {
#if !LJ_HASJIT
#define JIT_F_CMOV	1
#define JIT_F_SSE2	2
#endif
    flags |= ((features[3] >> 15)&1) * JIT_F_CMOV;
    flags |= ((features[3] >> 26)&1) * JIT_F_SSE2;
#if LJ_HASJIT
    flags |= ((features[2] >> 0)&1) * JIT_F_SSE3;
    flags |= ((features[2] >> 19)&1) * JIT_F_SSE4_1;
    if (vendor[2] == 0x6c65746e) {  /* Intel. */
      if ((features[0] & 0x0ff00f00) == 0x00000f00)  /* P4. */
	flags |= JIT_F_P4;  /* Currently unused. */
      else if ((features[0] & 0x0fff0ff0) == 0x000106c0)  /* Atom. */
	flags |= JIT_F_LEA_AGU;
    } else if (vendor[2] == 0x444d4163) {  /* AMD. */
      uint32_t fam = (features[0] & 0x0ff00f00);
      if (fam == 0x00000f00)  /* K8. */
	flags |= JIT_F_SPLIT_XMM;
      if (fam >= 0x00000f00)  /* K8, K10. */
	flags |= JIT_F_PREFER_IMUL;
    }
#endif
  }
  /* Check for required instruction set support on x86 (unnecessary on x64). */
#if LJ_TARGET_X86
#if !defined(LUAJIT_CPU_NOCMOV)
  if (!(flags & JIT_F_CMOV))
    luaL_error(L, "CPU not supported");
#endif
#if defined(LUAJIT_CPU_SSE2)
  if (!(flags & JIT_F_SSE2))
    luaL_error(L, "CPU does not support SSE2 (recompile without -DLUAJIT_CPU_SSE2)");
#endif
#endif
#elif LJ_TARGET_ARM
#if LJ_HASJIT
  int ver = LJ_ARCH_VERSION;  /* Compile-time ARM CPU detection. */
#if LJ_TARGET_LINUX
  if (ver < 70) {  /* Runtime ARM CPU detection. */
    struct utsname ut;
    uname(&ut);
    if (strncmp(ut.machine, "armv", 4) == 0) {
      if (ut.machine[4] >= '7')
	ver = 70;
      else if (ut.machine[4] == '6')
	ver = 60;
    }
  }
#endif
  flags |= ver >= 70 ? JIT_F_ARMV7 :
	   ver >= 61 ? JIT_F_ARMV6T2_ :
	   ver >= 60 ? JIT_F_ARMV6_ : 0;
  flags |= LJ_ARCH_HASFPU == 0 ? 0 : ver >= 70 ? JIT_F_VFPV3 : JIT_F_VFPV2;
#endif
#elif LJ_TARGET_PPC
#if LJ_HASJIT
#if LJ_ARCH_SQRT
  flags |= JIT_F_SQRT;
#endif
#if LJ_ARCH_ROUND
  flags |= JIT_F_ROUND;
#endif
#endif
#elif LJ_TARGET_PPCSPE
  /* Nothing to do. */
#elif LJ_TARGET_MIPS
#if LJ_HASJIT
  /* Compile-time MIPS CPU detection. */
#if LJ_ARCH_VERSION >= 20
  flags |= JIT_F_MIPS32R2;
#endif
  /* Runtime MIPS CPU detection. */
#if defined(__GNUC__)
  if (!(flags & JIT_F_MIPS32R2)) {
    int x;
    /* On MIPS32R1 rotr is treated as srl. rotr r2,r2,1 -> srl r2,r2,1. */
    __asm__("li $2, 1\n\t.long 0x00221042\n\tmove %0, $2" : "=r"(x) : : "$2");
    if (x) flags |= JIT_F_MIPS32R2;  /* Either 0x80000000 (R2) or 0 (R1). */
  }
#endif
#endif
#else
#error "Missing CPU detection for this architecture"
#endif
  UNUSED(L);
  return flags;
}